

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString PrintableStringFromOrNull(char *expected)

{
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  long in_RSI;
  char *in_RDI;
  SimpleString SVar2;
  SimpleString *in_stack_00000028;
  char *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  
  if (in_RSI == 0) {
    SimpleString::SimpleString(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    sVar1 = extraout_RDX;
  }
  else {
    StringFrom(in_stack_ffffffffffffffa8);
    SimpleString::printable(in_stack_00000028);
    SimpleString::~SimpleString((SimpleString *)0x11249f);
    sVar1 = extraout_RDX_00;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = in_RDI;
  return SVar2;
}

Assistant:

SimpleString PrintableStringFromOrNull(const char * expected)
{
    return (expected) ? StringFrom(expected).printable() : "(null)";
}